

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_sleep.c
# Opt level: O3

void tool_go_sleep(long ms)

{
  timeval timeout;
  timeval local_10;
  
  local_10.tv_sec = ms / 1000;
  local_10.tv_usec = (ms % 1000) * 1000;
  select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_10);
  return;
}

Assistant:

void tool_go_sleep(long ms)
{
#if defined(MSDOS)
  delay(ms);
#elif defined(_WIN32)
  Sleep((DWORD)ms);
#else
  struct timeval timeout;
  timeout.tv_sec = ms / 1000L;
  ms = ms % 1000L;
  timeout.tv_usec = (int)ms * 1000;
  select(0, NULL,  NULL, NULL, &timeout);
#endif
}